

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceIncludes
          (FileGenerator *this,Printer *printer)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  allocator local_251;
  string local_250;
  undefined1 local_230 [8];
  string basename;
  FileDescriptor *dep;
  int i;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  string local_a0;
  undefined1 local_70 [8];
  string target_basename;
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  Formatter::Formatter((Formatter *)((long)&target_basename.field_2 + 8),printer,&this->variables_);
  psVar4 = FileDescriptor::name_abi_cxx11_(this->file_);
  StripProto((string *)local_70,psVar4);
  if (((this->options_).opensource_runtime & 1U) == 0) {
    GetBootstrapBasename(&this->options_,(string *)local_70,(string *)local_70);
  }
  pcVar5 = ".pb.h";
  if (((this->options_).proto_h & 1U) != 0) {
    pcVar5 = ".proto.h";
  }
  std::__cxx11::string::operator+=((string *)local_70,pcVar5);
  CreateHeaderInclude(&local_a0,this,(string *)local_70,this->file_);
  Formatter::operator()
            ((Formatter *)((long)&target_basename.field_2 + 8),
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#include $1$\n\n#include <algorithm>\n\n"
             ,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"net/proto2/io/public/coded_stream.h",&local_c1);
  IncludeFile(this,&local_c0,printer);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"net/proto2/public/extension_set.h",&local_e9);
  IncludeFile(this,&local_e8,printer);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"net/proto2/public/wire_format_lite.h",&local_111);
  IncludeFile(this,&local_110,printer);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  bVar2 = UseUnknownFieldSet(this->file_,&this->options_);
  if ((!bVar2) &&
     (bVar2 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::empty(&this->message_generators_), !bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_138,"net/proto2/io/public/zero_copy_stream_impl_lite.h",&local_139);
    IncludeFile(this,&local_138,printer);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  bVar2 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"net/proto2/public/descriptor.h",&local_161);
    IncludeFile(this,&local_160,printer);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_188,"net/proto2/public/generated_message_reflection.h",&local_189);
    IncludeFile(this,&local_188,printer);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1b0,"net/proto2/public/reflection_ops.h",&local_1b1);
    IncludeFile(this,&local_1b0,printer);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"net/proto2/public/wire_format.h",&local_1d9);
    IncludeFile(this,&local_1d8,printer);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  bVar2 = HasGeneratedMethods(this->file_,&this->options_);
  if ((bVar2) && ((this->options_).tctable_mode != kTCTableNever)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&i,"net/proto2/public/generated_message_tctable_impl.h",
               (allocator *)((long)&dep + 7));
    IncludeFile(this,(string *)&i,printer);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dep + 7));
  }
  if (((this->options_).proto_h & 1U) != 0) {
    for (dep._0_4_ = 0; iVar1 = (int)dep, iVar3 = FileDescriptor::dependency_count(this->file_),
        iVar1 < iVar3; dep._0_4_ = (int)dep + 1) {
      basename.field_2._8_8_ = FileDescriptor::dependency(this->file_,(int)dep);
      if ((((this->options_).opensource_runtime & 1U) != 0) ||
         (bVar2 = IsDepWeak(this,(FileDescriptor *)basename.field_2._8_8_), !bVar2)) {
        psVar4 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
        StripProto((string *)local_230,psVar4);
        bVar2 = IsBootstrapProto(&this->options_,this->file_);
        if (bVar2) {
          GetBootstrapBasename(&this->options_,(string *)local_230,(string *)local_230);
        }
        Formatter::operator()
                  ((Formatter *)((long)&target_basename.field_2 + 8),"#include \"$1$.proto.h\"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
        std::__cxx11::string::~string((string *)local_230);
      }
    }
  }
  bVar2 = HasCordFields(this->file_,&this->options_);
  if (bVar2) {
    Formatter::operator()<>
              ((Formatter *)((long)&target_basename.field_2 + 8),
               "#include \"third_party/absl/strings/internal/string_constant.h\"\n");
  }
  Formatter::operator()<>
            ((Formatter *)((long)&target_basename.field_2 + 8),
             "// @@protoc_insertion_point(includes)\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"net/proto2/public/port_def.inc",&local_251);
  IncludeFile(this,&local_250,printer);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  Formatter::operator()<>
            ((Formatter *)((long)&target_basename.field_2 + 8),"\nPROTOBUF_PRAGMA_INIT_SEG\n");
  std::__cxx11::string::~string((string *)local_70);
  Formatter::~Formatter((Formatter *)((long)&target_basename.field_2 + 8));
  return;
}

Assistant:

void FileGenerator::GenerateSourceIncludes(io::Printer* printer) {
  Formatter format(printer, variables_);
  std::string target_basename = StripProto(file_->name());
  if (!options_.opensource_runtime) {
    GetBootstrapBasename(options_, target_basename, &target_basename);
  }
  target_basename += options_.proto_h ? ".proto.h" : ".pb.h";
  format(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n"
      "#include $1$\n"
      "\n"
      "#include <algorithm>\n"  // for swap()
      "\n",
      CreateHeaderInclude(target_basename, file_));

  IncludeFile("net/proto2/io/public/coded_stream.h", printer);
  // TODO(gerbens) This is to include parse_context.h, we need a better way
  IncludeFile("net/proto2/public/extension_set.h", printer);
  IncludeFile("net/proto2/public/wire_format_lite.h", printer);

  // Unknown fields implementation in lite mode uses StringOutputStream
  if (!UseUnknownFieldSet(file_, options_) && !message_generators_.empty()) {
    IncludeFile("net/proto2/io/public/zero_copy_stream_impl_lite.h", printer);
  }

  if (HasDescriptorMethods(file_, options_)) {
    IncludeFile("net/proto2/public/descriptor.h", printer);
    IncludeFile("net/proto2/public/generated_message_reflection.h", printer);
    IncludeFile("net/proto2/public/reflection_ops.h", printer);
    IncludeFile("net/proto2/public/wire_format.h", printer);
  }

  if (HasGeneratedMethods(file_, options_) &&
      options_.tctable_mode != Options::kTCTableNever) {
    IncludeFile("net/proto2/public/generated_message_tctable_impl.h", printer);
  }

  if (options_.proto_h) {
    // Use the smaller .proto.h files.
    for (int i = 0; i < file_->dependency_count(); i++) {
      const FileDescriptor* dep = file_->dependency(i);
      // Do not import weak deps.
      if (!options_.opensource_runtime && IsDepWeak(dep)) continue;
      std::string basename = StripProto(dep->name());
      if (IsBootstrapProto(options_, file_)) {
        GetBootstrapBasename(options_, basename, &basename);
      }
      format("#include \"$1$.proto.h\"\n", basename);
    }
  }
  if (HasCordFields(file_, options_)) {
    format(
        "#include \"third_party/absl/strings/internal/string_constant.h\"\n");
  }

  format("// @@protoc_insertion_point(includes)\n");
  IncludeFile("net/proto2/public/port_def.inc", printer);

  // For MSVC builds, we use #pragma init_seg to move the initialization of our
  // libraries to happen before the user code.
  // This worksaround the fact that MSVC does not do constant initializers when
  // required by the standard.
  format("\nPROTOBUF_PRAGMA_INIT_SEG\n");
}